

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O2

Pdr_Set_t * Pdr_ManTernarySim(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Vec_Int_t *p_00;
  Vec_Int_t *vPiLits;
  Vec_Int_t *vCiObjs;
  Pdr_Man_t *p_01;
  Vec_Int_t *vValues;
  Vec_Int_t *vValues_00;
  Vec_Int_t *vNodes;
  Vec_Int_t *vUndo;
  Vec_Int_t *vVis;
  Vec_Int_t *vCi2Rem;
  Vec_Int_t *vRes;
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  abctime aVar7;
  Pdr_Set_t *pCube_00;
  Pdr_Man_t *pPVar8;
  FILE *pFVar9;
  long lVar10;
  
  p_00 = p->vPrio;
  vPiLits = p->vLits;
  vCiObjs = p->vCiObjs;
  p_01 = (Pdr_Man_t *)p->vCoObjs;
  vValues = p->vCiVals;
  vValues_00 = p->vCoVals;
  vNodes = p->vNodes;
  vUndo = p->vUndo;
  vVis = p->vVisits;
  vCi2Rem = p->vCi2Rem;
  vRes = p->vRes;
  pPVar8 = p;
  aVar4 = Abc_Clock();
  *(int *)((long)&p_01->pPars + 4) = 0;
  if (pCube == (Pdr_Set_t *)0x0) {
    pvVar5 = Vec_PtrEntry(p->pAig->vCos,p->iOutCur);
    pPVar8 = p_01;
    Vec_IntPush((Vec_Int_t *)p_01,*(int *)((long)pvVar5 + 0x24));
    iVar2 = (int)pPVar8;
  }
  else {
    for (lVar10 = 0; iVar2 = (int)pPVar8, lVar10 < pCube->nLits; lVar10 = lVar10 + 1) {
      if (*(int *)(&pCube->field_0x14 + lVar10 * 4) != -1) {
        pvVar5 = Vec_PtrEntry(p->pAig->vCos,
                              (*(int *)(&pCube->field_0x14 + lVar10 * 4) >> 1) + p->pAig->nTruePos);
        pPVar8 = p_01;
        Vec_IntPush((Vec_Int_t *)p_01,*(int *)((long)pvVar5 + 0x24));
      }
    }
  }
  if (p->pPars->fVeryVerbose != 0) {
    Abc_Print(iVar2,"Trying to justify cube ");
    if (pCube == (Pdr_Set_t *)0x0) {
      Abc_Print(iVar2,"<prop=fail>");
    }
    else {
      pFVar9 = _stdout;
      Pdr_SetPrint(_stdout,pCube,p->pAig->nRegs,(Vec_Int_t *)0x0);
      iVar2 = (int)pFVar9;
    }
    Abc_Print(iVar2," in frame %d.\n",(ulong)(uint)k);
  }
  Pdr_ManCollectCone(p->pAig,(Vec_Int_t *)p_01,vCiObjs,vNodes);
  Pdr_ManCollectValues(p,k,vCiObjs,vValues);
  Pdr_ManCollectValues(p,k,(Vec_Int_t *)p_01,vValues_00);
  if (p->pPars->fVeryVerbose != 0) {
    Pdr_ManPrintCex(p->pAig,vCiObjs,vValues,(Vec_Int_t *)0x0);
  }
  iVar2 = Pdr_ManSimDataInit(p->pAig,vCiObjs,vValues,vNodes,(Vec_Int_t *)p_01,vValues_00,
                             (Vec_Int_t *)0x0);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                  ,0x195,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
  }
  vCi2Rem->nSize = 0;
  iVar2 = 0;
  do {
    iVar3 = vCiObjs->nSize;
    if (iVar3 <= iVar2) {
      for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
        pAVar1 = p->pAig;
        iVar3 = Vec_IntEntry(vCiObjs,iVar2);
        pAVar6 = Aig_ManObj(pAVar1,iVar3);
        iVar3 = Saig_ObjIsLo(p->pAig,pAVar6);
        if (iVar3 != 0) {
          iVar3 = Aig_ObjCioId(pAVar6);
          if (p_00 != (Vec_Int_t *)0x0) {
            iVar3 = Vec_IntEntry(p_00,iVar3 - p->pAig->nTruePis);
            if (iVar3 != 0) {
              vUndo->nSize = 0;
              iVar3 = Pdr_ManExtendOne(p->pAig,pAVar6,vUndo,vVis);
              if (iVar3 == 0) {
                Pdr_ManExtendUndo(p->pAig,vUndo);
              }
              else {
                Vec_IntPush(vCi2Rem,pAVar6->Id);
              }
            }
          }
        }
        iVar3 = vCiObjs->nSize;
      }
      if (p->pPars->fVeryVerbose != 0) {
        Pdr_ManPrintCex(p->pAig,vCiObjs,vValues,vCi2Rem);
      }
      iVar2 = Pdr_ManSimDataInit(p->pAig,vCiObjs,vValues,vNodes,(Vec_Int_t *)p_01,vValues_00,vCi2Rem
                                );
      if (iVar2 != 0) {
        Pdr_ManDeriveResult(p->pAig,vCiObjs,vValues,vCi2Rem,vRes,vPiLits);
        if (vRes->nSize < 1) {
          __assert_fail("Vec_IntSize(vRes) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                        ,0x1dc,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
        }
        aVar7 = Abc_Clock();
        p->tTsim = p->tTsim + (aVar7 - aVar4);
        pCube_00 = Pdr_SetCreate(vRes,vPiLits);
        if (k != 0) {
          iVar2 = Pdr_SetIsInit(pCube_00,-1);
          if (iVar2 != 0) {
            __assert_fail("k == 0 || !Pdr_SetIsInit(pRes, -1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                          ,0x1df,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
          }
        }
        return pCube_00;
      }
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                    ,0x1d8,"Pdr_Set_t *Pdr_ManTernarySim(Pdr_Man_t *, int, Pdr_Set_t *)");
    }
    pAVar1 = p->pAig;
    iVar3 = Vec_IntEntry(vCiObjs,iVar2);
    pAVar6 = Aig_ManObj(pAVar1,iVar3);
    iVar3 = Saig_ObjIsLo(p->pAig,pAVar6);
    if (iVar3 != 0) {
      iVar3 = Aig_ObjCioId(pAVar6);
      if (p_00 != (Vec_Int_t *)0x0) {
        iVar3 = Vec_IntEntry(p_00,iVar3 - p->pAig->nTruePis);
        if (iVar3 != 0) goto LAB_0047a737;
      }
      vUndo->nSize = 0;
      iVar3 = Pdr_ManExtendOne(p->pAig,pAVar6,vUndo,vVis);
      if (iVar3 == 0) {
        Pdr_ManExtendUndo(p->pAig,vUndo);
      }
      else {
        Vec_IntPush(vCi2Rem,pAVar6->Id);
      }
    }
LAB_0047a737:
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

Pdr_Set_t * Pdr_ManTernarySim( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Pdr_Set_t * pRes;
    Vec_Int_t * vPrio   = p->vPrio;    // priority flops (flop indices)
    Vec_Int_t * vPiLits = p->vLits;    // array of literals (0/1 PI values)
    Vec_Int_t * vCiObjs = p->vCiObjs;  // cone leaves (CI obj IDs)
    Vec_Int_t * vCoObjs = p->vCoObjs;  // cone roots (CO obj IDs)
    Vec_Int_t * vCiVals = p->vCiVals;  // cone leaf values (0/1 CI values)
    Vec_Int_t * vCoVals = p->vCoVals;  // cone root values (0/1 CO values)
    Vec_Int_t * vNodes  = p->vNodes;   // cone nodes (node obj IDs)
    Vec_Int_t * vUndo   = p->vUndo;    // cone undos (node obj IDs)
    Vec_Int_t * vVisits = p->vVisits;  // intermediate (obj IDs)
    Vec_Int_t * vCi2Rem = p->vCi2Rem;  // CIs to be removed (CI obj IDs)
    Vec_Int_t * vRes    = p->vRes;     // final result (flop literals)
    Aig_Obj_t * pObj;
    int i, Entry, RetValue;
    abctime clk = Abc_Clock();

    // collect CO objects
    Vec_IntClear( vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
//        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, (p->pPars->iOutput==-1)?0:p->pPars->iOutput)) );
        Vec_IntPush( vCoObjs, Aig_ObjId(Aig_ManCo(p->pAig, p->iOutCur)) );
    }
    else // the target is the cube
    {
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Saig_ManLi(p->pAig, (pCube->Lits[i] >> 1));
            Vec_IntPush( vCoObjs, Aig_ObjId(pObj) );
        }
    }
if ( p->pPars->fVeryVerbose )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Aig_ManRegNum(p->pAig), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Pdr_ManCollectCone( p->pAig, vCoObjs, vCiObjs, vNodes );
    // collect values
    Pdr_ManCollectValues( p, k, vCiObjs, vCiVals );
    Pdr_ManCollectValues( p, k, vCoObjs, vCoVals );
    // simulate for the first time
if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, NULL );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, NULL );
    assert( RetValue );

#if 1
    // try removing high-priority flops
    Vec_IntClear( vCi2Rem );
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio != NULL && Vec_IntEntry( vPrio, Entry ) != 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
    // try removing low-priority flops
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio == NULL || Vec_IntEntry( vPrio, Entry ) == 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
#else
    // try removing low-priority flops
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio == NULL || Vec_IntEntry( vPrio, Entry ) == 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
    // try removing high-priority flops
    Vec_IntClear( vCi2Rem );
    Aig_ManForEachObjVec( vCiObjs, p->pAig, pObj, i )
    {
        if ( !Saig_ObjIsLo( p->pAig, pObj ) )
            continue;
        Entry = Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pAig);
        if ( vPrio != NULL && Vec_IntEntry( vPrio, Entry ) != 0 )
            continue;
        Vec_IntClear( vUndo );
        if ( Pdr_ManExtendOne( p->pAig, pObj, vUndo, vVisits ) )
            Vec_IntPush( vCi2Rem, Aig_ObjId(pObj) );
        else
            Pdr_ManExtendUndo( p->pAig, vUndo );
    }
#endif

if ( p->pPars->fVeryVerbose )
Pdr_ManPrintCex( p->pAig, vCiObjs, vCiVals, vCi2Rem );
    RetValue = Pdr_ManSimDataInit( p->pAig, vCiObjs, vCiVals, vNodes, vCoObjs, vCoVals, vCi2Rem );
    assert( RetValue );

    // derive the set of resulting registers
    Pdr_ManDeriveResult( p->pAig, vCiObjs, vCiVals, vCi2Rem, vRes, vPiLits );
    assert( Vec_IntSize(vRes) > 0 );
    p->tTsim += Abc_Clock() - clk;
    pRes = Pdr_SetCreate( vRes, vPiLits );
    assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}